

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIBoolDecoder::decode(FIBoolDecoder *this,uint8_t *data,size_t len)

{
  ulong uVar1;
  byte bVar2;
  DeadlyImportError *this_00;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  size_type __n;
  long lVar4;
  ulong uVar5;
  shared_ptr<const_Assimp::FIValue> sVar6;
  undefined1 local_69;
  FIBoolDecoder local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  vector<bool,_std::allocator<bool>_> local_50;
  
  if (in_RCX != 0) {
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    bVar2 = *(byte *)len;
    uVar5 = (ulong)(bVar2 >> 4);
    uVar1 = in_RCX * 8 - 4;
    __n = uVar1 - uVar5;
    std::vector<bool,_std::allocator<bool>_>::reserve(&local_50,__n);
    if (uVar1 != uVar5) {
      lVar4 = __n + (__n == 0);
      do {
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_50,(bool)((bVar2 & 8) >> 3));
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    local_68 = (FIBoolDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::FIBoolValueImpl,std::allocator<Assimp::FIBoolValueImpl>,std::vector<bool,std::allocator<bool>>>
              (a_Stack_60,(FIBoolValueImpl **)&local_68,
               (allocator<Assimp::FIBoolValueImpl> *)&local_69,&local_50);
    *this = local_68;
    this[1] = (FIBoolDecoder)a_Stack_60[0]._M_pi;
    _Var3._M_pi = extraout_RDX;
    if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      _Var3._M_pi = extraout_RDX_00;
    }
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<bool> value;
        uint8_t b = *data++;
        size_t unusedBits = b >> 4;
        size_t numBools = (len * 8) - 4 - unusedBits;
        value.reserve(numBools);
        uint8_t mask = 1 << 3;
        for (size_t i = 0; i < numBools; ++i) {
            if (!mask) {
                mask = 1 << 7;
                b = *data++;
            }
            value.push_back((b & mask) != 0);
        }
        return FIBoolValue::create(std::move(value));
    }